

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerApp::ValidatePSKd(Error *__return_storage_ptr__,string *aPSKd)

{
  byte bVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  size_type sVar9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  writer write;
  string local_c0;
  undefined1 local_a0 [40];
  undefined1 local_78 [16];
  char *local_68;
  size_t local_60;
  format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  sVar3 = aPSKd->_M_string_length;
  if (sVar3 - 6 < 0x1b) {
    pcVar4 = (aPSKd->_M_dataplus)._M_p;
    for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
      bVar1 = pcVar4[sVar9];
      if ((9 < (int)(char)bVar1 - 0x30U) && (iVar5 = isupper((int)(char)bVar1), iVar5 == 0)) {
        local_78._0_4_ = char_type;
        local_78._8_8_ = "PSKd includes non-digit and non-uppercase characters: {}";
        local_68 = (char *)0x38;
        local_60 = 0x100000000;
        local_50 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)::fmt::v10::detail::
                      parse_format_specs<char,fmt::v10::detail::compile_parse_context<char>>;
        pcVar6 = "PSKd includes non-digit and non-uppercase characters: {}";
        write.handler_ =
             (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78;
        local_58 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_78;
        while (pcVar6 != "") {
          cVar2 = *pcVar6;
          pcVar7 = pcVar6;
          while (cVar2 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>
              ::writer::operator()((writer *)&write,pcVar6,"");
              goto LAB_00148961;
            }
            cVar2 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>::
          writer::operator()((writer *)&write,pcVar6,pcVar7);
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char>&>
                             (pcVar7,"",(format_string_checker<char> *)local_78);
        }
LAB_00148961:
        fmt_01.size_ = 8;
        fmt_01.data_ = (char *)0x38;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_78;
        local_78._0_8_ = (ulong)(uint)bVar1;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_c0,(v10 *)"PSKd includes non-digit and non-uppercase characters: {}",
                   fmt_01,args_01);
        local_a0._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&local_c0);
        goto LAB_00148884;
      }
      uVar8 = bVar1 - 0x49;
      if ((uVar8 < 0x12) && ((0x20141U >> (uVar8 & 0x1f) & 1) != 0)) {
        local_78._0_4_ = char_type;
        local_78._8_8_ = "PSKd includes invalid uppercase characters: {}";
        local_68 = (char *)0x2e;
        local_60 = 0x100000000;
        local_50 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)::fmt::v10::detail::
                      parse_format_specs<char,fmt::v10::detail::compile_parse_context<char>>;
        pcVar6 = "PSKd includes invalid uppercase characters: {}";
        write.handler_ =
             (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78;
        local_58 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_78;
        while (pcVar6 != "") {
          cVar2 = *pcVar6;
          pcVar7 = pcVar6;
          while (cVar2 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>
              ::writer::operator()((writer *)&write,pcVar6,"");
              goto LAB_00148847;
            }
            cVar2 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>::
          writer::operator()((writer *)&write,pcVar6,pcVar7);
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char>&>
                             (pcVar7,"",(format_string_checker<char> *)local_78);
        }
LAB_00148847:
        local_78._0_8_ = ZEXT18(bVar1);
        fmt_00.size_ = 8;
        fmt_00.data_ = (char *)0x2e;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)local_78;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_c0,(v10 *)"PSKd includes invalid uppercase characters: {}",fmt_00,args_00)
        ;
        local_a0._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&local_c0);
        goto LAB_00148884;
      }
    }
  }
  else {
    local_78._0_4_ = ulong_long_type;
    local_78._4_4_ = ulong_long_type;
    local_78._8_4_ = 4;
    local_68 = "PSKd length(={}) exceeds range [{}, {}]";
    local_60 = 0x27;
    local_58 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x300000000;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_40 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_38 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcVar6 = "PSKd length(={}) exceeds range [{}, {}]";
    write.handler_ =
         (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_78;
    local_50 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78;
    while (pcVar6 != "") {
      cVar2 = *pcVar6;
      pcVar7 = pcVar6;
      while (cVar2 != '{') {
        pcVar7 = pcVar7 + 1;
        if (pcVar7 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
          ::writer::operator()(&write,pcVar6,"");
          goto LAB_0014874b;
        }
        cVar2 = *pcVar7;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
      ::writer::operator()(&write,pcVar6,pcVar7);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long,unsigned_long>&>
                         (pcVar7,"",
                          (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_78);
    }
LAB_0014874b:
    local_78._0_8_ = aPSKd->_M_string_length;
    local_68 = (char *)0x6;
    local_58 = (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x20;
    fmt.size_ = 0x444;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"PSKd length(={}) exceeds range [{}, {}]",fmt,args);
    local_a0._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&local_c0);
LAB_00148884:
    Error::operator=(__return_storage_ptr__,(Error *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::ValidatePSKd(const std::string &aPSKd)
{
    Error error;

    VerifyOrExit(aPSKd.size() >= kMinJoinerDeviceCredentialLength && aPSKd.size() <= kMaxJoinerDeviceCredentialLength,
                 error = ERROR_INVALID_ARGS("PSKd length(={}) exceeds range [{}, {}]", aPSKd.size(),
                                            kMinJoinerDeviceCredentialLength, kMaxJoinerDeviceCredentialLength));

    for (auto c : aPSKd)
    {
        VerifyOrExit(isdigit(c) || isupper(c),
                     error = ERROR_INVALID_ARGS("PSKd includes non-digit and non-uppercase characters: {}", c));
        VerifyOrExit(c != 'I' && c != 'O' && c != 'Q' && c != 'Z',
                     error = ERROR_INVALID_ARGS("PSKd includes invalid uppercase characters: {}", c));
    }

exit:
    return error;
}